

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

AggregateFunction *
duckdb::ContinuousQuantileListFunction::GetAggregate
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType local_40;
  LogicalType list_of_double;
  
  GetContinuousQuantileTemplated<duckdb::ListContinuousQuantile>(__return_storage_ptr__,type);
  ::std::__cxx11::string::assign
            ((char *)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                      super_Function.name);
  __return_storage_ptr__->bind = Bind;
  __return_storage_ptr__->serialize = QuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = Deserialize;
  LogicalType::LogicalType(&local_40,DOUBLE);
  LogicalType::LIST(&list_of_double,&local_40);
  LogicalType::~LogicalType(&local_40);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
            (&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &list_of_double);
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  LogicalType::~LogicalType(&list_of_double);
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetAggregate(const LogicalType &type) {
		auto fun = GetContinuousQuantileList(type);
		fun.name = "quantile_cont";
		fun.bind = Bind;
		fun.serialize = QuantileBindData::Serialize;
		fun.deserialize = Deserialize;
		// temporarily push an argument so we can bind the actual quantile
		auto list_of_double = LogicalType::LIST(LogicalType::DOUBLE);
		fun.arguments.push_back(list_of_double);
		fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		return fun;
	}